

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O3

void dspl_Render(ECommand_t activeCmd)

{
  short sVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  ulong uVar3;
  uint uVar5;
  int iVar6;
  SolStack_t *pSVar7;
  SolStack_t *stackPtr;
  size_t sVar8;
  WINDOW *pWVar9;
  char *pcVar10;
  int y;
  int y_00;
  int y_01;
  int iVar11;
  ECommand_t cmd;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ECardFace_t *pEVar17;
  ECardFace_t *pEVar18;
  Card_t card;
  Card_t card_00;
  
  werase(_stdscr);
  pSVar7 = tbl_GetColorStacks();
  cmd = CMD_COLOR0;
  lVar13 = 0;
  do {
    uVar5 = (uint)lVar13;
    DrawCmdLabel(cmd,uVar5 + 0x20,8);
    DrawTopCard(pSVar7,uVar5 + 0x1f,y);
    if ((ulong)activeCmd * 10 + -0x46 == lVar13) {
      DrawLabel("sel",uVar5 | 0x20,3);
    }
    lVar13 = lVar13 + 10;
    pSVar7 = pSVar7 + 1;
    cmd = cmd + CMD_EXIT;
  } while (lVar13 != 0x28);
  pSVar7 = tbl_GetPack();
  stackPtr = tbl_GetRest();
  DrawCmdLabel(CMD_NEXT,2,8);
  DrawTopCard(pSVar7,1,y_00);
  DrawCmdLabel(CMD_PACK,0xc,8);
  DrawTopCard(stackPtr,0xb,y_01);
  if (activeCmd == CMD_PACK) {
    DrawLabel("sel",0xc,3);
  }
  pSVar7 = tbl_GetDeskStacks();
  pEVar17 = &pSVar7->m_cards[0].m_face;
  lVar13 = 0;
  do {
    iVar15 = (int)lVar13 * 10;
    DrawCmdLabel((ECommand_t)(lVar13 + 0xbU),(int)lVar13 * 10 + 2,0xc);
    iVar12 = iVar15 + 1;
    if (pSVar7[lVar13].m_size == 0) {
      iVar11 = 0xd;
      DrawEmptyGrid(iVar12,0xd);
      if (pSVar7[lVar13].m_size != 0) goto LAB_00102736;
    }
    else {
LAB_00102736:
      iVar11 = 0xd;
      uVar14 = 0;
      pEVar18 = pEVar17;
      do {
        uVar2 = ((Card_t *)(pEVar18 + -2))->m_type;
        uVar4 = ((Card_t *)(pEVar18 + -2))->m_color;
        card.m_color = uVar4;
        card.m_type = uVar2;
        card.m_face = *pEVar18;
        DrawFullCard(card,iVar12,iVar11);
        uVar14 = uVar14 + 1;
        uVar3 = pSVar7[lVar13].m_size;
        iVar11 = iVar11 + 2;
        pEVar18 = pEVar18 + 3;
      } while (uVar14 < uVar3);
      iVar11 = (int)uVar3 * 2 + 0xd;
    }
    if (lVar13 + 0xbU == (ulong)activeCmd) {
      DrawLabel("sel",iVar15 + 2,iVar11);
    }
    lVar13 = lVar13 + 1;
    pEVar17 = pEVar17 + 0x9e;
  } while (lVar13 != 7);
  if (FlyingCard.m_enabled == true) {
    card_00.m_face = FlyingCard.m_card.m_face;
    card_00.m_type = FlyingCard.m_card.m_type;
    card_00.m_color = FlyingCard.m_card.m_color;
    DrawFullCard(card_00,FlyingCard.m_x,FlyingCard.m_y);
  }
  if (_stdscr == (WINDOW *)0x0) {
    wattr_on(0,0x600,0);
    iVar12 = -2;
    iVar15 = -1;
  }
  else {
    iVar12 = (int)_stdscr->_maxx;
    sVar1 = _stdscr->_maxy;
    iVar15 = sVar1 + 1;
    wattr_on(_stdscr,0x600,0);
    if (1 < iVar12) {
      iVar16 = sVar1 + -1;
      iVar11 = 1;
      do {
        iVar6 = wmove(_stdscr,iVar16,iVar11);
        if (iVar6 != -1) {
          waddch(_stdscr,0x20);
        }
        iVar11 = iVar11 + 1;
      } while (iVar12 != iVar11);
      goto LAB_00102856;
    }
  }
  iVar16 = iVar15 + -2;
LAB_00102856:
  pWVar9 = _stdscr;
  iVar11 = dd_GetHighScore();
  iVar6 = tbl_GetCurrentScore();
  mvwprintw(pWVar9,iVar16,2,"High Score: %-5d   Your Score: %-5d",iVar11,iVar6);
  DrawRectangleInWindow(_stdscr,0,iVar15 + -3,iVar12,2);
  wattr_off(_stdscr,0x600,0);
  pcVar10 = Message;
  if (*Message != '\0') {
    sVar8 = strlen(Message);
    DrawLabel(pcVar10,0x21 - (int)(sVar8 >> 1),9);
  }
  wrefresh(_stdscr);
  if (activeCmd != CMD_HELP) {
    return;
  }
  pWVar9 = (WINDOW *)newwin(0x14,0x37,3,8);
  wbkgd(pWVar9,0x500);
  wattr_on(pWVar9,0x500,0);
  pcVar10 = ctrl_GetHelp();
  mvwprintw(pWVar9,1,0,"%s",pcVar10);
  DrawRectangleInWindow(pWVar9,0,0,0x36,0x13);
  wattr_off(pWVar9,0x500,0);
  wrefresh(pWVar9);
  return;
}

Assistant:

void dspl_Render(ECommand_t activeCmd)
{
  erase();
  DisplayColors(activeCmd);
  DisplayPack(activeCmd);
  DisplayDesk(activeCmd);
  DisplayFlying();
  DisplayStats();

  if (Message[0] != '\0') {
    DisplayMessage();
  }

  refresh();
  if (activeCmd == CMD_HELP) {
    DisplayHelp();
  }
}